

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeadArgumentElimination.cpp
# Opt level: O1

bool __thiscall
wasm::DAE::refineArgumentTypes
          (DAE *this,Function *func,vector<wasm::Call_*,_std::allocator<wasm::Call_*>_> *calls,
          Module *module,DAEFunctionInfo *info)

{
  long *plVar1;
  long *plVar2;
  undefined1 auVar3 [8];
  bool bVar4;
  size_t __n;
  Type TVar5;
  Index index;
  ulong uVar6;
  LocalUpdatingMode localUpdating;
  HeapType *this_00;
  Signature SVar7;
  undefined1 local_98 [8];
  vector<wasm::LUBFinder,_std::allocator<wasm::LUBFinder>_> lubs;
  Type local_60;
  Type newParams;
  vector<wasm::Type,_std::allocator<wasm::Type>_> newParamTypes;
  Type local_38;
  Type originalType;
  
  localUpdating = (LocalUpdatingMode)info;
  if (((module->features).features & 0x400) == 0) {
    bVar4 = false;
  }
  else {
    lubs.super__Vector_base<wasm::LUBFinder,_std::allocator<wasm::LUBFinder>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)calls;
    __n = Function::getNumParams(func);
    newParams.id = 0;
    newParamTypes.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    std::vector<wasm::Type,_std::allocator<wasm::Type>_>::reserve
              ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)&newParams,__n);
    std::vector<wasm::LUBFinder,_std::allocator<wasm::LUBFinder>_>::vector
              ((vector<wasm::LUBFinder,_std::allocator<wasm::LUBFinder>_> *)local_98,__n,
               (allocator_type *)&local_38);
    if (__n != 0) {
      uVar6 = 0;
      do {
        index = (Index)uVar6;
        local_38 = Function::getLocalType(func,index);
        if (((local_38.id & 1) != 0 || local_38.id < 7) ||
           (bVar4 = SortedVector::has(&info->unusedParams,index), auVar3 = local_98, bVar4)) {
          if (newParamTypes.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
              super__Vector_impl_data._M_start == (pointer)0x0) {
            bVar4 = false;
            std::vector<wasm::Type,std::allocator<wasm::Type>>::_M_realloc_insert<wasm::Type_const&>
                      ((vector<wasm::Type,std::allocator<wasm::Type>> *)&newParams,(iterator)0x0,
                       &local_38);
          }
          else {
            (newParamTypes.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
             super__Vector_impl_data._M_start)->id = (uintptr_t)local_38;
            newParamTypes.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
            super__Vector_impl_data._M_start =
                 newParamTypes.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
                 super__Vector_impl_data._M_start + 1;
            bVar4 = false;
          }
        }
        else {
          plVar1 = (long *)lubs.
                           super__Vector_base<wasm::LUBFinder,_std::allocator<wasm::LUBFinder>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage[1].lub.id;
          plVar2 = (long *)((lubs.
                             super__Vector_base<wasm::LUBFinder,_std::allocator<wasm::LUBFinder>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage)->lub).id;
          do {
            if (plVar2 == plVar1) break;
            if (*(ulong *)(*plVar2 + 0x18) <= uVar6) {
              __assert_fail("index < usedElements",
                            "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/mixed_arena.h"
                            ,0xbc,
                            "T &ArenaVectorBase<ArenaVector<wasm::Expression *>, wasm::Expression *>::operator[](size_t) const [SubType = ArenaVector<wasm::Expression *>, T = wasm::Expression *]"
                           );
            }
            TVar5 = wasm::Type::getLeastUpperBound
                              ((((pointer)((long)auVar3 + uVar6 * 8))->lub).id,
                               *(uintptr_t *)(*(long *)(*(long *)(*plVar2 + 0x10) + uVar6 * 8) + 8))
            ;
            (((pointer)((long)auVar3 + uVar6 * 8))->lub).id = TVar5.id;
            plVar2 = plVar2 + 1;
          } while (TVar5.id != local_38.id);
          bVar4 = true;
          if ((((pointer)((long)auVar3 + uVar6 * 8))->lub).id != 1) {
            local_60.id = (((pointer)((long)auVar3 + uVar6 * 8))->lub).id;
            if (newParamTypes.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
                super__Vector_impl_data._M_start == (pointer)0x0) {
              std::vector<wasm::Type,_std::allocator<wasm::Type>_>::_M_realloc_insert<wasm::Type>
                        ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)&newParams,(iterator)0x0
                         ,&local_60);
            }
            else {
              (newParamTypes.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
               super__Vector_impl_data._M_start)->id = (uintptr_t)local_60;
              newParamTypes.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
              super__Vector_impl_data._M_start =
                   newParamTypes.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl
                   .super__Vector_impl_data._M_start + 1;
            }
            bVar4 = false;
          }
        }
        if (bVar4) {
          bVar4 = false;
          goto LAB_00839ae7;
        }
        uVar6 = (ulong)(index + 1);
      } while (uVar6 < __n);
    }
    wasm::Type::Type(&local_60,(Tuple *)&newParams);
    this_00 = &func->type;
    SVar7 = HeapType::getSignature(this_00);
    bVar4 = local_60.id != SVar7.params.id.id;
    if (bVar4) {
      TypeUpdating::updateParamTypes
                ((TypeUpdating *)func,(Function *)&newParams,
                 (vector<wasm::Type,_std::allocator<wasm::Type>_> *)module,(Module *)0x0,
                 localUpdating);
      TVar5.id = local_60.id;
      SVar7 = HeapType::getSignature(this_00);
      SVar7.params.id = TVar5.id;
      HeapType::HeapType((HeapType *)&local_38,SVar7);
      this_00->id = local_38.id;
    }
LAB_00839ae7:
    if (local_98 != (undefined1  [8])0x0) {
      operator_delete((void *)local_98,
                      (long)lubs.
                            super__Vector_base<wasm::LUBFinder,_std::allocator<wasm::LUBFinder>_>.
                            _M_impl.super__Vector_impl_data._M_finish - (long)local_98);
    }
    if (newParams.id != 0) {
      operator_delete((void *)newParams.id,-newParams.id);
    }
  }
  return bVar4;
}

Assistant:

bool refineArgumentTypes(Function* func,
                           const std::vector<Call*>& calls,
                           Module* module,
                           const DAEFunctionInfo& info) {
    if (!module->features.hasGC()) {
      return false;
    }
    auto numParams = func->getNumParams();
    std::vector<Type> newParamTypes;
    newParamTypes.reserve(numParams);
    std::vector<LUBFinder> lubs(numParams);
    for (Index i = 0; i < numParams; i++) {
      auto originalType = func->getLocalType(i);
      // If the parameter type is not a reference, there is nothing to refine.
      // And if it is unused, also do nothing, as we can leave it to the other
      // parts of this pass to optimize it properly, which avoids having to
      // think about corner cases involving refining the type of an unused
      // param (in particular, unused params are turned into locals, which means
      // we'd need to think about defaultability etc.).
      if (!originalType.isRef() || info.unusedParams.has(i)) {
        newParamTypes.push_back(originalType);
        continue;
      }
      auto& lub = lubs[i];
      for (auto* call : calls) {
        auto* operand = call->operands[i];
        lub.note(operand->type);
        if (lub.getLUB() == originalType) {
          // We failed to refine this parameter to anything more specific.
          break;
        }
      }

      // Nothing is sent here at all; leave such optimizations to DCE.
      if (!lub.noted()) {
        return false;
      }
      newParamTypes.push_back(lub.getLUB());
    }

    // Check if we are able to optimize here before we do the work to scan the
    // function body.
    auto newParams = Type(newParamTypes);
    if (newParams == func->getParams()) {
      return false;
    }

    // We can do this!
    TypeUpdating::updateParamTypes(func, newParamTypes, *module);

    // Update the function's type.
    func->setParams(newParams);

    return true;
  }